

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

void icetStateDestroy(IceTState state)

{
  IceTEnum pname;
  IceTEnum pname_00;
  
  for (pname_00 = 0; pname_00 != 0x200; pname_00 = pname_00 + 1) {
    stateFree(pname_00,state);
  }
  free(state);
  return;
}

Assistant:

void icetStateDestroy(IceTState state)
{
    IceTEnum pname;

    for (pname = ICET_STATE_ENGINE_START;
         pname < ICET_STATE_ENGINE_END;
         pname++) {
        stateFree(pname, state);
    }
    free(state);
}